

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverCore.c
# Opt level: O0

void Msat_SolverPrintStats(Msat_Solver_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Msat_Solver_t *p_local;
  
  uVar1 = p->nVars;
  uVar2 = Msat_ClauseVecReadSize(p->vClauses);
  uVar3 = Msat_ClauseVecReadSize(p->vLearned);
  printf("C solver (%d vars; %d clauses; %d learned):\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3);
  printf("starts        : %d\n",(p->Stats).nStarts & 0xffffffff);
  printf("conflicts     : %d\n",(p->Stats).nConflicts & 0xffffffff);
  printf("decisions     : %d\n",(p->Stats).nDecisions & 0xffffffff);
  printf("propagations  : %d\n",(p->Stats).nPropagations & 0xffffffff);
  printf("inspects      : %d\n",(p->Stats).nInspects & 0xffffffff);
  return;
}

Assistant:

void Msat_SolverPrintStats( Msat_Solver_t * p )
{
    printf("C solver (%d vars; %d clauses; %d learned):\n", 
        p->nVars, Msat_ClauseVecReadSize(p->vClauses), Msat_ClauseVecReadSize(p->vLearned) );
    printf("starts        : %d\n", (int)p->Stats.nStarts);
    printf("conflicts     : %d\n", (int)p->Stats.nConflicts);
    printf("decisions     : %d\n", (int)p->Stats.nDecisions);
    printf("propagations  : %d\n", (int)p->Stats.nPropagations);
    printf("inspects      : %d\n", (int)p->Stats.nInspects);
}